

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

char * cast_node_set_to_string(lyxp_set *set,lyd_node *cur_node,lys_module *param_3,int options)

{
  uint uVar1;
  lyd_node *node;
  char *pcVar2;
  int fake_cont;
  lyxp_node_type local_2c [2];
  lyxp_node_type root_type;
  
  uVar1 = *(uint *)&set->field_0x8;
  if (uVar1 == 4) {
    moveto_get_root(cur_node,options,local_2c);
    pcVar2 = strdup(*(char **)(*(long *)set + 0x20));
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)0x0;
      ly_log(param_3->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "cast_node_set_to_string");
    }
  }
  else {
    node = *(lyd_node **)set;
    if (-1 < (char)node->validity) {
      moveto_get_root(cur_node,options,local_2c);
      if (uVar1 - 2 < 2) {
        fake_cont = 0;
      }
      else {
        if (1 < uVar1) {
          ly_log(param_3->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                 ,0x234);
          return (char *)0x0;
        }
        fake_cont = 1;
      }
      pcVar2 = cast_string_elem(node,param_3,fake_cont,local_2c[0]);
      return pcVar2;
    }
    pcVar2 = (char *)0x0;
    ly_vlog(param_3->ctx,LYE_XPATH_DUMMY,LY_VLOG_LYD,node,node->schema->name);
  }
  return pcVar2;
}

Assistant:

static char *
cast_node_set_to_string(struct lyxp_set *set, struct lyd_node *cur_node, struct lys_module *local_mod, int options)
{
    enum lyxp_node_type root_type;
    char *str;

    if ((set->val.nodes[0].type != LYXP_NODE_ATTR) && (set->val.nodes[0].node->validity & LYD_VAL_INUSE)) {
        LOGVAL(local_mod->ctx, LYE_XPATH_DUMMY, LY_VLOG_LYD, set->val.nodes[0].node, set->val.nodes[0].node->schema->name);
        return NULL;
    }

    moveto_get_root(cur_node, options, &root_type);

    switch (set->val.nodes[0].type) {
    case LYXP_NODE_ROOT:
    case LYXP_NODE_ROOT_CONFIG:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 1, root_type);
    case LYXP_NODE_ELEM:
    case LYXP_NODE_TEXT:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 0, root_type);
    case LYXP_NODE_ATTR:
        str = strdup(set->val.attrs[0].attr->value_str);
        if (!str) {
            LOGMEM(local_mod->ctx);
        }
        return str;
    }

    LOGINT(local_mod->ctx);
    return NULL;
}